

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_json.c
# Opt level: O1

_Bool JSON_parse(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  json_value *json;
  gravity_value_t value;
  
  if ((1 < nargs) && (args[1].isa == gravity_class_string)) {
    json = json_parse((char *)(args[1].field_1.p)->objclass,
                      (ulong)*(uint *)((long)&(args[1].field_1.p)->identifier + 4));
    if (json != (json_value *)0x0) {
      value = JSON_value(vm,json);
      goto LAB_0013571d;
    }
  }
  value.field_1.n = 0;
  value.isa = gravity_class_null;
LAB_0013571d:
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool JSON_parse (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs < 2) RETURN_VALUE(VALUE_FROM_NULL, rindex);
    
    // value to parse
    gravity_value_t value = GET_VALUE(1);
    if (!VALUE_ISA_STRING(value)) RETURN_VALUE(VALUE_FROM_NULL, rindex);
    
    gravity_string_t *string = VALUE_AS_STRING(value);
    json_value *json = json_parse(string->s, string->len);
    if (!json) RETURN_VALUE(VALUE_FROM_NULL, rindex);
    
    RETURN_VALUE(JSON_value(vm, json), rindex);
}